

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O1

void __thiscall
Qentem::QTest::IsEqual<Qentem::String<char>,char[37]>
          (QTest *this,String<char> *left,char (*right) [37],unsigned_long line)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((this->error_ == true) && (this->continue_on_error_ != true)) {
    return;
  }
  if ((*right)[0] == '\0') {
    uVar2 = 0;
LAB_00104656:
    if (left->length_ == (SizeT)uVar2) {
      return;
    }
  }
  else if ((*right)[0] == *left->storage_) {
    uVar2 = 1;
    do {
      pcVar1 = *right + uVar2;
      if (*pcVar1 == '\0') goto LAB_00104656;
      uVar3 = uVar2 & 0xffffffff;
      uVar2 = uVar2 + 1;
    } while (*pcVar1 == left->storage_[uVar3]);
  }
  this->error_ = true;
  PrintErrorMessage<Qentem::String<char>,char[37]>(this,false,left,right,line);
  return;
}

Assistant:

QENTEM_NOINLINE void IsEqual(const Value1_T &left, const Value2_T &right, unsigned long line) {
        if ((!error_ || continue_on_error_) && (left != right)) {
            error_ = true;
            QTest::PrintErrorMessage(false, left, right, line);
        }
    }